

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifdef(bifcxdef *ctx,int argc)

{
  prpnum prop;
  long lVar1;
  uint uVar2;
  int in_ESI;
  long in_RDI;
  int flag;
  objnum def_objn;
  runsdef val;
  uint ofs;
  objnum objn;
  prpnum prpn;
  undefined8 in_stack_ffffffffffffff98;
  int err;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined8 in_stack_ffffffffffffffa8;
  dattyp typ;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined8 in_stack_ffffffffffffffb8;
  objnum *in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  undefined2 in_stack_ffffffffffffffd4;
  prpnum in_stack_ffffffffffffffd6;
  
  typ = (dattyp)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  err = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (*(char *)(lVar1 + -0x10) != '\x02') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),err);
  }
  prop = *(prpnum *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\r') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),err);
  }
  if (in_ESI == 3) {
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign((runcxdef *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),err);
    }
    in_stack_ffffffffffffffc0 = *(objnum **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    uVar3 = SUB84(in_stack_ffffffffffffffc0,0);
  }
  else {
    uVar3 = 1;
  }
  uVar2 = objgetap((mcmcxdef *)
                   CONCAT26(in_stack_ffffffffffffffd6,CONCAT24(in_stack_ffffffffffffffd4,uVar3)),0,
                   prop,in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  switch(uVar3) {
  case 1:
    runpush((runcxdef *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),typ,
            (runsdef *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    break;
  case 2:
    runpush((runcxdef *)
            CONCAT17(uVar2 != 0 && in_stack_ffffffffffffffd6 == prop,in_stack_ffffffffffffffb0),
            (dattyp)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20),
            (runsdef *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    break;
  case 3:
    runpush((runcxdef *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),typ,
            (runsdef *)
            CONCAT17(uVar2 != 0 && in_stack_ffffffffffffffd6 != prop,in_stack_ffffffffffffffa0));
    break;
  case 4:
    if (uVar2 == 0) {
      runpnil((runcxdef *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    }
    else {
      runpobj((runcxdef *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
              (objnum)((uint)typ >> 0x10));
    }
    break;
  default:
    *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "defined";
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
    runsign((runcxdef *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),err);
  }
  return;
}

Assistant:

void bifdef(bifcxdef *ctx, int argc)
{
    prpnum  prpn;
    objnum  objn;
    uint    ofs;
    runsdef val;
    objnum  def_objn;
    int     flag;

    /* get object and property arguments */
    objn = runpopobj(ctx->bifcxrun);
    prpn = runpopprp(ctx->bifcxrun);

    /* if there's a flag argument, get it as well */
    if (argc == 3)
    {
        /* get the flag */
        flag = (int)runpopnum(ctx->bifcxrun);
    }
    else
    {
        /* check the argument count */
        bifcntargs(ctx, 2, argc);

        /* use the default flag value (DEFINES_OR_INHERITS) */
        flag = BIFDEF_DEFINED_ANY;
    }

    /* get the offset of the property and the defining object */
    ofs = objgetap(ctx->bifcxrun->runcxmem, objn, prpn, &def_objn, FALSE);

    /* determine the type of information they want */
    switch(flag)
    {
    case BIFDEF_DEFINED_ANY:
        /* if the property is defined, return true, else return nil */
        runpush(ctx->bifcxrun, runclog(ofs != 0), &val);
        break;

    case BIFDEF_DEFINED_DIRECTLY:
        /* if the property is defined directly by the object, return true */
        runpush(ctx->bifcxrun, runclog(ofs != 0 && def_objn == objn), &val);
        break;
        
    case BIFDEF_DEFINED_INHERITS:
        /* if the property is inherited, return true */
        runpush(ctx->bifcxrun, runclog(ofs != 0 && def_objn != objn), &val);
        break;

    case BIFDEF_DEFINED_GET_CLASS:
        /* if it's defined, return the defining object, otherwise nil */
        if (ofs == 0)
            runpnil(ctx->bifcxrun);
        else
            runpobj(ctx->bifcxrun, def_objn);
        break;

    default:
        /* invalid flag value */
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "defined");
    }
}